

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::MeanDamageRatioWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  bool bVar1;
  reference this_00;
  reference ppVar2;
  pointer ppVar3;
  mapped_type *this_01;
  undefined4 in_register_0000000c;
  long *plVar4;
  int in_stack_00000008;
  code *local_130;
  _Self local_110;
  _Self local_108;
  iterator iter;
  lossval lv;
  pair<const_outkey2,_OutLosses> x;
  _Self local_c8;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  undefined1 local_a0 [8];
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  items;
  int eptype_local;
  int epcalc_local;
  offset_in_OutLosses_to_subr GetOutLoss_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  std::
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::map((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
         *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
            ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             local_a0,&this->periodstoweighting_);
  this_00 = std::
            vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
            ::operator[](this->out_loss_,0);
  __end1 = std::
           map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
           ::begin(this_00);
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
       ::end(this_00);
  while (bVar1 = std::operator!=(&__end1,&local_c8), bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end1);
    x.first.sidx = (int)(ppVar2->second).max_out_loss;
    lv.value = (OASIS_FLOAT)(ppVar2->first).summary_id;
    lv._20_4_ = (ppVar2->first).period_no;
    x.first.summary_id = (ppVar2->first).sidx;
    x.first.period_no = (int)(ppVar2->second).agg_out_loss;
    plVar4 = (long *)((long)&x.first.period_no + CONCAT44(in_register_0000000c,epcalc));
    local_130 = (code *)GetOutLoss;
    if ((GetOutLoss & 1) != 0) {
      local_130 = *(code **)(*plVar4 + (GetOutLoss - 1));
    }
    lv.period_weighting._0_4_ = (*local_130)(plVar4);
    local_108._M_node =
         (_Base_ptr)
         std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::find
                   (&this->periodstoweighting_,(key_type *)&lv.field_0x14);
    local_110._M_node =
         (_Base_ptr)
         std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::end
                   (&this->periodstoweighting_);
    bVar1 = std::operator!=(&local_108,&local_110);
    if (bVar1) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->(&local_108);
      lv._0_8_ = ppVar3->second;
      iter._M_node._0_4_ = lv._20_4_;
      this_01 = std::
                map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                ::operator[]((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                              *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count,(key_type *)&lv.value);
      std::vector<lossval,_std::allocator<lossval>_>::push_back(this_01,(value_type *)&iter);
    }
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::erase
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               local_a0,(key_type *)&lv.field_0x14);
    std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end1);
  }
  WriteExceedanceProbabilityTable
            (this,fileIDs,
             (map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
              *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (float)this->samplesize_,eptype,eptype_tvar,in_stack_00000008,
             (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             local_a0,1);
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::~map
            ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             local_a0);
  std::
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::~map((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void aggreports::MeanDamageRatioWithWeighting(const std::vector<int> &fileIDs,
	OASIS_FLOAT (OutLosses::*GetOutLoss)(), const int epcalc,
	const int eptype, const int eptype_tvar) {

  std::map<int, lossvec2> items;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  for (auto x : (*out_loss_)[MEANS]) {
    lossval lv;
    lv.value = (x.second.*GetOutLoss)();
    auto iter = periodstoweighting_.find(x.first.period_no);
    if (iter != periodstoweighting_.end()) {
      lv.period_weighting = iter->second;
      lv.period_no = x.first.period_no;   // for debugging
      items[x.first.summary_id].push_back(lv);
    }
    unusedperiodstoweighting.erase(x.first.period_no);
  }

  WriteExceedanceProbabilityTable(fileIDs, items, samplesize_, epcalc, eptype,
				  eptype_tvar, unusedperiodstoweighting);

}